

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall
cppcms::application::add
          (application *this,application *app,string *name,string *url,string *regex,int part)

{
  url_dispatcher *this_00;
  url_mapper *this_01;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  application *in_RDI;
  char *in_R8;
  char *__rwflag;
  uint in_R9D;
  undefined4 in_register_0000008c;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  
  __rwflag = in_R8;
  uVar1 = in_R9D;
  add((application *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_RDI);
  this_00 = dispatcher((application *)0x3b0ace);
  url_dispatcher::mount
            (this_00,in_R8,in_RSI,(char *)(ulong)uVar1,(ulong)__rwflag,
             (void *)CONCAT44(in_register_0000008c,in_R9D));
  this_01 = mapper((application *)0x3b0aed);
  url_mapper::mount(this_01,in_RDX,in_RCX,in_RSI,(ulong)__rwflag,
                    (void *)CONCAT44(in_register_0000008c,in_R9D));
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url,std::string const &regex,int part)
{
	add(app);
	dispatcher().mount(regex,app,part);
	mapper().mount(name,url,app);
}